

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateAccessorDeclarations
          (SingularStringView *this,Printer *p)

{
  Printer *pPVar1;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  Printer *local_150;
  anon_union_8_2_2904990b_for_scope_ *local_148;
  Descriptor *local_140;
  anon_union_8_2_2904990b_for_scope_ local_138;
  anon_union_8_2_3066aaf9_for_type_descriptor_ aStack_130;
  undefined1 local_128 [32];
  Descriptor *local_108;
  anon_union_8_2_2904990b_for_scope_ local_100;
  anon_union_8_2_3066aaf9_for_type_descriptor_ aStack_f8;
  anon_union_8_2_2904990b_for_scope_ local_f0;
  FeatureSet *pFStack_e8;
  code *local_e0;
  code *local_d8;
  byte local_d0;
  undefined1 **local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  undefined1 local_a8;
  _Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> local_a0;
  undefined8 local_58;
  DescriptorNames local_50;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_48;
  
  local_128[0] = '\0';
  local_128[1] = 0;
  local_128[2] = '\0';
  local_128[3] = 0;
  local_128._4_4_ = 0;
  local_128._8_8_ = "";
  local_150 = p;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)(local_128 + 0x18),(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)local_128,
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(1),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars.len_ = ((long)local_108 - local_128._24_8_ >> 3) * -0x2c8590b21642c859;
  vars.ptr_ = (pointer)local_128._24_8_;
  io::Printer::WithDefs(&local_48,p,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)(local_128 + 0x18));
  pPVar1 = local_150;
  local_58._0_1_ = '\x04';
  local_58._1_1_ = 0;
  local_58._2_1_ = '\0';
  local_58._3_1_ = 0;
  local_58._4_4_ = 0;
  local_50.payload_ = "set_";
  prefixes.len_ = 0x100000001;
  prefixes.ptr_ = (pointer)0x1;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)(local_128 + 0x18),(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)&local_58,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_00.len_ = ((long)local_108 - local_128._24_8_ >> 3) * -0x2c8590b21642c859;
  vars_00.ptr_ = (pointer)local_128._24_8_;
  io::Printer::WithDefs
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_128,pPVar1,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)(local_128 + 0x18));
  pPVar1 = local_150;
  local_148 = &local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"donated","");
  if (local_148 == &local_138) {
    aStack_f8 = aStack_130;
    local_128._24_8_ = &local_100;
  }
  else {
    local_128._24_8_ = local_148;
  }
  local_100._1_7_ = local_138._1_7_;
  local_100._0_1_ = local_138._0_1_;
  local_108 = local_140;
  local_140 = (Descriptor *)0x0;
  local_138._0_1_ = 0;
  local_148 = &local_138;
  local_f0.containing_oneof = (OneofDescriptor *)operator_new(0x18);
  (((Message *)&(local_f0.containing_oneof)->super_SymbolBase)->super_MessageLite)._vptr_MessageLite
       = (_func_int **)this;
  ((local_f0.containing_oneof)->all_names_).payload_ = (char *)&local_150;
  *(undefined1 *)&(local_f0.containing_oneof)->containing_type_ = 0;
  local_d8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_invoke;
  pFStack_e8 = (FeatureSet *)0x0;
  local_e0 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  local_d0 = 1;
  local_c0 = 0;
  local_b8 = 0;
  local_a8 = 0;
  local_c8 = (undefined1 **)&local_b8;
  std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,0x53a374);
  local_a0._M_engaged = false;
  io::Printer::Emit(pPVar1,local_128 + 0x18,1,0x18a,
                    "\n            $DEPRECATED$ ::absl::string_view $name$() const;\n            template <typename Arg_ = ::std::string&&>\n            $DEPRECATED$ void $set_name$(Arg_&& arg);\n\n            private:\n            ::absl::string_view _internal_$name$() const;\n            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(::absl::string_view value);\n            $donated$;\n\n            public:\n          "
                   );
  if (local_a0._M_engaged == true) {
    std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
              (&local_a0);
  }
  if (local_c8 != (undefined1 **)&local_b8) {
    operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
    ::_S_vtable._M_arr[local_d0]._M_data)
            ((anon_class_1_0_00000001 *)&local_58,
             (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
              *)&local_f0);
  local_d0 = 0xff;
  if ((anon_union_8_2_2904990b_for_scope_ *)local_128._24_8_ != &local_100) {
    operator_delete((void *)local_128._24_8_,(ulong)&(local_100.containing_oneof)->field_0x1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,CONCAT71(local_138._1_7_,local_138._0_1_) + 1);
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_128);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_48);
  return;
}

Assistant:

void SingularStringView::GenerateAccessorDeclarations(io::Printer* p) const {
  auto v1 = p->WithVars(AnnotatedAccessors(field_, {""}));
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_"}, AnnotationCollector::kSet));

  p->Emit({{"donated",
            [&] {
              if (!is_inlined()) return;
              p->Emit(R"cc(
                PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;
              )cc");
            }}},
          R"cc(
            $DEPRECATED$ ::absl::string_view $name$() const;
            template <typename Arg_ = ::std::string&&>
            $DEPRECATED$ void $set_name$(Arg_&& arg);

            private:
            ::absl::string_view _internal_$name$() const;
            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(::absl::string_view value);
            $donated$;

            public:
          )cc");
}